

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

Symbol * __thiscall
anon_unknown.dwarf_127610f::InstanceBuilder::createInstance
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax,
          HierarchyOverrideNode *overrideNode)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar1;
  BumpAllocator *this_00;
  ConfigBlockSymbol *args;
  undefined4 extraout_var;
  Symbol *pSVar2;
  HierarchyOverrideNode *in_RDX;
  EVP_PKEY_CTX *src;
  Symbol *extraout_RDX;
  SyntaxNode *in_RSI;
  span<const_unsigned_int,_18446744073709551615UL> *in_RDI;
  InstanceSymbol *inst;
  type *loc;
  type *name;
  InstanceSymbol *in_stack_ffffffffffffff70;
  span<unsigned_int,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  ParameterBuilder *in_stack_ffffffffffffff98;
  DefinitionSymbol *in_stack_ffffffffffffffa0;
  Compilation *in_stack_ffffffffffffffa8;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffffb0;
  Compilation *in_stack_ffffffffffffffb8;
  ConfigBlockSymbol *pCVar3;
  HierarchicalInstanceSyntax *in_stack_ffffffffffffffd0;
  Scope *scope;
  
  slang::ast::ParameterBuilder::setOverrides((ParameterBuilder *)in_RDI[0xe]._M_ptr,in_RDX);
  getNameLoc(in_stack_ffffffffffffffd0);
  std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
             0x8e535c);
  this_00 = (BumpAllocator *)
            std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
                        *)0x8e536b);
  args = (ConfigBlockSymbol *)
         slang::BumpAllocator::
         emplace<slang::ast::InstanceSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::DefinitionSymbol_const&,slang::ast::ParameterBuilder&,slang::bitmask<slang::ast::InstanceFlags>&>
                   (this_00,in_stack_ffffffffffffffb8,
                    (basic_string_view<char,_std::char_traits<char>_> *)
                    in_stack_ffffffffffffffb0._M_extent_value,
                    (SourceLocation *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                    in_stack_ffffffffffffff98,
                    (bitmask<slang::ast::InstanceFlags> *)in_stack_ffffffffffffffd0);
  iVar1 = slang::SmallVectorBase<unsigned_int>::copy
                    ((SmallVectorBase<unsigned_int> *)(in_RDI + 0x11),
                     (EVP_PKEY_CTX *)in_RDI[0xc]._M_extent._M_extent_value,src);
  scope = (Scope *)CONCAT44(extraout_var,iVar1);
  pSVar2 = extraout_RDX;
  std::span<const_unsigned_int,_18446744073709551615UL>::span<unsigned_int,_18446744073709551615UL>
            (in_RDI,in_stack_ffffffffffffff78);
  (args->super_Scope).compilation = in_stack_ffffffffffffffa8;
  ((__extent_storage<18446744073709551615UL> *)&(args->super_Scope).thisSym)->_M_extent_value =
       in_stack_ffffffffffffffb0._M_extent_value;
  slang::ast::Symbol::setSyntax(&args->super_Symbol,in_RSI);
  pCVar3 = args;
  slang::not_null<const_slang::ast::Scope_*>::operator*
            ((not_null<const_slang::ast::Scope_*> *)0x8e542d);
  syntax_00._M_extent._M_extent_value = in_stack_ffffffffffffffb0._M_extent_value;
  syntax_00._M_ptr = (pointer)in_stack_ffffffffffffffa8;
  slang::ast::Symbol::setAttributes(pSVar2,scope,syntax_00);
  if (in_RDI[0xf]._M_ptr != (pointer)0x0) {
    if (in_RDI[0xf]._M_extent._M_extent_value == 0) {
      (pCVar3->super_Scope).firstMember = (Symbol *)in_RDI[0xf]._M_ptr;
    }
    else {
      pSVar2 = (Symbol *)
               slang::BumpAllocator::
               emplace<slang::ast::ResolvedConfig,slang::ast::ConfigBlockSymbol_const&,slang::ast::InstanceSymbol&>
                         ((BumpAllocator *)in_RDI,args,in_stack_ffffffffffffff70);
      (pCVar3->super_Scope).firstMember = pSVar2;
    }
  }
  return &pCVar3->super_Symbol;
}

Assistant:

Symbol* createInstance(const HierarchicalInstanceSyntax& syntax,
                           const HierarchyOverrideNode* overrideNode) {
        paramBuilder->setOverrides(overrideNode);
        auto [name, loc] = getNameLoc(syntax);
        auto inst = comp.emplace<InstanceSymbol>(comp, name, loc, *definition, *paramBuilder,
                                                 flags);
        inst->arrayPath = path.copy(comp);
        inst->setSyntax(syntax);
        inst->setAttributes(*context.scope, attributes);

        if (resolvedConfig) {
            if (newConfigRoot)
                inst->resolvedConfig = comp.emplace<ResolvedConfig>(*newConfigRoot, *inst);
            else
                inst->resolvedConfig = resolvedConfig;
        }

        return inst;
    }